

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall caffe::V1LayerParameter::MergeFrom(V1LayerParameter *this,V1LayerParameter *from)

{
  byte *pbVar1;
  uint32 *puVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  string *initial_value;
  string *psVar6;
  LogMessage *pLVar7;
  V0LayerParameter *this_00;
  ConcatParameter *this_01;
  ConvolutionParameter *this_02;
  DataParameter *this_03;
  DropoutParameter *this_04;
  HDF5DataParameter *this_05;
  HDF5OutputParameter *this_06;
  ImageDataParameter *this_07;
  InfogainLossParameter *this_08;
  InnerProductParameter *this_09;
  LRNParameter *this_10;
  PoolingParameter *this_11;
  WindowDataParameter *this_12;
  PowerParameter *this_13;
  MemoryDataParameter *this_14;
  ArgMaxParameter *this_15;
  EltwiseParameter *this_16;
  ThresholdParameter *this_17;
  DummyDataParameter *this_18;
  AccuracyParameter *this_19;
  HingeLossParameter *this_20;
  ReLUParameter *this_21;
  SliceParameter *this_22;
  MVNParameter *this_23;
  TransformationParameter *this_24;
  TanHParameter *this_25;
  SigmoidParameter *this_26;
  SoftmaxParameter *this_27;
  ContrastiveLossParameter *this_28;
  ExpParameter *this_29;
  LossParameter *this_30;
  V0LayerParameter *from_00;
  ConcatParameter *from_01;
  ConvolutionParameter *from_02;
  DataParameter *from_03;
  DropoutParameter *from_04;
  HDF5DataParameter *from_05;
  HDF5OutputParameter *from_06;
  ImageDataParameter *from_07;
  InfogainLossParameter *from_08;
  InnerProductParameter *from_09;
  LRNParameter *from_10;
  PoolingParameter *from_11;
  WindowDataParameter *from_12;
  PowerParameter *from_13;
  MemoryDataParameter *from_14;
  ArgMaxParameter *from_15;
  EltwiseParameter *from_16;
  ThresholdParameter *from_17;
  DummyDataParameter *from_18;
  AccuracyParameter *from_19;
  HingeLossParameter *from_20;
  ReLUParameter *from_21;
  SliceParameter *from_22;
  MVNParameter *from_23;
  TransformationParameter *from_24;
  TanHParameter *from_25;
  SigmoidParameter *from_26;
  SoftmaxParameter *from_27;
  ContrastiveLossParameter *from_28;
  ExpParameter *from_29;
  LossParameter *from_30;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
               ,0xa60c);
    pLVar7 = google::protobuf::internal::LogMessage::operator<<
                       (&local_58,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_59,pLVar7);
    google::protobuf::internal::LogMessage::~LogMessage(&local_58);
  }
  pvVar5 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar5 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe));
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->bottom_).super_RepeatedPtrFieldBase,&(from->bottom_).super_RepeatedPtrFieldBase
            );
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->top_).super_RepeatedPtrFieldBase,&(from->top_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
            (&(this->blobs_).super_RepeatedPtrFieldBase,&(from->blobs_).super_RepeatedPtrFieldBase);
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar7 = google::protobuf::internal::LogMessage::operator<<
                       (&local_58,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_59,pLVar7);
    google::protobuf::internal::LogMessage::~LogMessage(&local_58);
  }
  iVar3 = (from->blobs_lr_).current_size_;
  if (iVar3 != 0) {
    google::protobuf::RepeatedField<float>::Reserve
              (&this->blobs_lr_,iVar3 + (this->blobs_lr_).current_size_);
    memcpy(((this->blobs_lr_).rep_)->elements + (this->blobs_lr_).current_size_,
           ((from->blobs_lr_).rep_)->elements,(long)(from->blobs_lr_).current_size_ << 2);
    (this->blobs_lr_).current_size_ =
         (this->blobs_lr_).current_size_ + (from->blobs_lr_).current_size_;
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar7 = google::protobuf::internal::LogMessage::operator<<
                       (&local_58,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_59,pLVar7);
    google::protobuf::internal::LogMessage::~LogMessage(&local_58);
  }
  iVar3 = (from->weight_decay_).current_size_;
  if (iVar3 != 0) {
    google::protobuf::RepeatedField<float>::Reserve
              (&this->weight_decay_,iVar3 + (this->weight_decay_).current_size_);
    memcpy(((this->weight_decay_).rep_)->elements + (this->weight_decay_).current_size_,
           ((from->weight_decay_).rep_)->elements,(long)(from->weight_decay_).current_size_ << 2);
    (this->weight_decay_).current_size_ =
         (this->weight_decay_).current_size_ + (from->weight_decay_).current_size_;
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
            (&(this->include_).super_RepeatedPtrFieldBase,
             &(from->include_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
            (&(this->exclude_).super_RepeatedPtrFieldBase,
             &(from->exclude_).super_RepeatedPtrFieldBase);
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar7 = google::protobuf::internal::LogMessage::operator<<
                       (&local_58,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_59,pLVar7);
    google::protobuf::internal::LogMessage::~LogMessage(&local_58);
  }
  iVar3 = (from->loss_weight_).current_size_;
  if (iVar3 != 0) {
    google::protobuf::RepeatedField<float>::Reserve
              (&this->loss_weight_,iVar3 + (this->loss_weight_).current_size_);
    memcpy(((this->loss_weight_).rep_)->elements + (this->loss_weight_).current_size_,
           ((from->loss_weight_).rep_)->elements,(long)(from->loss_weight_).current_size_ << 2);
    (this->loss_weight_).current_size_ =
         (this->loss_weight_).current_size_ + (from->loss_weight_).current_size_;
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->param_).super_RepeatedPtrFieldBase,&(from->param_).super_RepeatedPtrFieldBase);
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar7 = google::protobuf::internal::LogMessage::operator<<
                       (&local_58,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_59,pLVar7);
    google::protobuf::internal::LogMessage::~LogMessage(&local_58);
  }
  iVar3 = (from->blob_share_mode_).current_size_;
  if (iVar3 != 0) {
    google::protobuf::RepeatedField<int>::Reserve
              (&this->blob_share_mode_,iVar3 + (this->blob_share_mode_).current_size_);
    memcpy(((this->blob_share_mode_).rep_)->elements + (this->blob_share_mode_).current_size_,
           ((from->blob_share_mode_).rep_)->elements,
           (long)(from->blob_share_mode_).current_size_ << 2);
    (this->blob_share_mode_).current_size_ =
         (this->blob_share_mode_).current_size_ + (from->blob_share_mode_).current_size_;
  }
  uVar4 = (from->_has_bits_).has_bits_[0];
  if ((char)uVar4 != '\0') {
    if ((uVar4 & 1) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      initial_value = (from->name_).ptr_;
      psVar6 = (this->name_).ptr_;
      if (psVar6 != initial_value) {
        if (psVar6 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (&this->name_,initial_value);
        }
        else {
          std::__cxx11::string::_M_assign((string *)psVar6);
        }
      }
    }
    if ((uVar4 & 2) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      this_00 = this->layer_;
      if (this_00 == (V0LayerParameter *)0x0) {
        this_00 = (V0LayerParameter *)operator_new(0x100);
        V0LayerParameter::V0LayerParameter(this_00);
        this->layer_ = this_00;
      }
      from_00 = from->layer_;
      if (from_00 == (V0LayerParameter *)0x0) {
        from_00 = (V0LayerParameter *)&_V0LayerParameter_default_instance_;
      }
      V0LayerParameter::MergeFrom(this_00,from_00);
    }
    if ((uVar4 & 4) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
      this_01 = this->concat_param_;
      if (this_01 == (ConcatParameter *)0x0) {
        this_01 = (ConcatParameter *)operator_new(0x20);
        ConcatParameter::ConcatParameter(this_01);
        this->concat_param_ = this_01;
      }
      from_01 = from->concat_param_;
      if (from_01 == (ConcatParameter *)0x0) {
        from_01 = (ConcatParameter *)&_ConcatParameter_default_instance_;
      }
      ConcatParameter::MergeFrom(this_01,from_01);
    }
    if ((uVar4 & 8) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
      this_02 = this->convolution_param_;
      if (this_02 == (ConvolutionParameter *)0x0) {
        this_02 = (ConvolutionParameter *)operator_new(0x98);
        ConvolutionParameter::ConvolutionParameter(this_02);
        this->convolution_param_ = this_02;
      }
      from_02 = from->convolution_param_;
      if (from_02 == (ConvolutionParameter *)0x0) {
        from_02 = (ConvolutionParameter *)&_ConvolutionParameter_default_instance_;
      }
      ConvolutionParameter::MergeFrom(this_02,from_02);
    }
    if ((uVar4 & 0x10) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
      this_03 = this->data_param_;
      if (this_03 == (DataParameter *)0x0) {
        this_03 = (DataParameter *)operator_new(0x48);
        DataParameter::DataParameter(this_03);
        this->data_param_ = this_03;
      }
      from_03 = from->data_param_;
      if (from_03 == (DataParameter *)0x0) {
        from_03 = (DataParameter *)&_DataParameter_default_instance_;
      }
      DataParameter::MergeFrom(this_03,from_03);
    }
    if ((uVar4 & 0x20) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
      this_04 = this->dropout_param_;
      if (this_04 == (DropoutParameter *)0x0) {
        this_04 = (DropoutParameter *)operator_new(0x20);
        DropoutParameter::DropoutParameter(this_04);
        this->dropout_param_ = this_04;
      }
      from_04 = from->dropout_param_;
      if (from_04 == (DropoutParameter *)0x0) {
        from_04 = (DropoutParameter *)&_DropoutParameter_default_instance_;
      }
      DropoutParameter::MergeFrom(this_04,from_04);
    }
    if ((uVar4 & 0x40) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x40;
      this_05 = this->hdf5_data_param_;
      if (this_05 == (HDF5DataParameter *)0x0) {
        this_05 = (HDF5DataParameter *)operator_new(0x28);
        HDF5DataParameter::HDF5DataParameter(this_05);
        this->hdf5_data_param_ = this_05;
      }
      from_05 = from->hdf5_data_param_;
      if (from_05 == (HDF5DataParameter *)0x0) {
        from_05 = (HDF5DataParameter *)&_HDF5DataParameter_default_instance_;
      }
      HDF5DataParameter::MergeFrom(this_05,from_05);
    }
    if ((char)uVar4 < '\0') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x80;
      this_06 = this->hdf5_output_param_;
      if (this_06 == (HDF5OutputParameter *)0x0) {
        this_06 = (HDF5OutputParameter *)operator_new(0x20);
        HDF5OutputParameter::HDF5OutputParameter(this_06);
        this->hdf5_output_param_ = this_06;
      }
      from_06 = from->hdf5_output_param_;
      if (from_06 == (HDF5OutputParameter *)0x0) {
        from_06 = (HDF5OutputParameter *)&_HDF5OutputParameter_default_instance_;
      }
      HDF5OutputParameter::MergeFrom(this_06,from_06);
    }
  }
  if ((uVar4 & 0xff00) != 0) {
    if ((uVar4 >> 8 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar1 = *pbVar1 | 1;
      this_07 = this->image_data_param_;
      if (this_07 == (ImageDataParameter *)0x0) {
        this_07 = (ImageDataParameter *)operator_new(0x50);
        ImageDataParameter::ImageDataParameter(this_07);
        this->image_data_param_ = this_07;
      }
      from_07 = from->image_data_param_;
      if (from_07 == (ImageDataParameter *)0x0) {
        from_07 = (ImageDataParameter *)&_ImageDataParameter_default_instance_;
      }
      ImageDataParameter::MergeFrom(this_07,from_07);
    }
    if ((uVar4 >> 9 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar1 = *pbVar1 | 2;
      this_08 = this->infogain_loss_param_;
      if (this_08 == (InfogainLossParameter *)0x0) {
        this_08 = (InfogainLossParameter *)operator_new(0x20);
        InfogainLossParameter::InfogainLossParameter(this_08);
        this->infogain_loss_param_ = this_08;
      }
      from_08 = from->infogain_loss_param_;
      if (from_08 == (InfogainLossParameter *)0x0) {
        from_08 = (InfogainLossParameter *)&_InfogainLossParameter_default_instance_;
      }
      InfogainLossParameter::MergeFrom(this_08,from_08);
    }
    if ((uVar4 >> 10 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar1 = *pbVar1 | 4;
      this_09 = this->inner_product_param_;
      if (this_09 == (InnerProductParameter *)0x0) {
        this_09 = (InnerProductParameter *)operator_new(0x38);
        InnerProductParameter::InnerProductParameter(this_09);
        this->inner_product_param_ = this_09;
      }
      from_09 = from->inner_product_param_;
      if (from_09 == (InnerProductParameter *)0x0) {
        from_09 = (InnerProductParameter *)&_InnerProductParameter_default_instance_;
      }
      InnerProductParameter::MergeFrom(this_09,from_09);
    }
    if ((uVar4 >> 0xb & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar1 = *pbVar1 | 8;
      this_10 = this->lrn_param_;
      if (this_10 == (LRNParameter *)0x0) {
        this_10 = (LRNParameter *)operator_new(0x30);
        LRNParameter::LRNParameter(this_10);
        this->lrn_param_ = this_10;
      }
      from_10 = from->lrn_param_;
      if (from_10 == (LRNParameter *)0x0) {
        from_10 = (LRNParameter *)&_LRNParameter_default_instance_;
      }
      LRNParameter::MergeFrom(this_10,from_10);
    }
    if ((uVar4 >> 0xc & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar1 = *pbVar1 | 0x10;
      this_11 = this->pooling_param_;
      if (this_11 == (PoolingParameter *)0x0) {
        this_11 = (PoolingParameter *)operator_new(0x48);
        PoolingParameter::PoolingParameter(this_11);
        this->pooling_param_ = this_11;
      }
      from_11 = from->pooling_param_;
      if (from_11 == (PoolingParameter *)0x0) {
        from_11 = (PoolingParameter *)&_PoolingParameter_default_instance_;
      }
      PoolingParameter::MergeFrom(this_11,from_11);
    }
    if ((uVar4 >> 0xd & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar1 = *pbVar1 | 0x20;
      this_12 = this->window_data_param_;
      if (this_12 == (WindowDataParameter *)0x0) {
        this_12 = (WindowDataParameter *)operator_new(0x58);
        WindowDataParameter::WindowDataParameter(this_12);
        this->window_data_param_ = this_12;
      }
      from_12 = from->window_data_param_;
      if (from_12 == (WindowDataParameter *)0x0) {
        from_12 = (WindowDataParameter *)&_WindowDataParameter_default_instance_;
      }
      WindowDataParameter::MergeFrom(this_12,from_12);
    }
    if ((uVar4 >> 0xe & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar1 = *pbVar1 | 0x40;
      this_13 = this->power_param_;
      if (this_13 == (PowerParameter *)0x0) {
        this_13 = (PowerParameter *)operator_new(0x28);
        PowerParameter::PowerParameter(this_13);
        this->power_param_ = this_13;
      }
      from_13 = from->power_param_;
      if (from_13 == (PowerParameter *)0x0) {
        from_13 = (PowerParameter *)&_PowerParameter_default_instance_;
      }
      PowerParameter::MergeFrom(this_13,from_13);
    }
    if ((short)uVar4 < 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar1 = *pbVar1 | 0x80;
      this_14 = this->memory_data_param_;
      if (this_14 == (MemoryDataParameter *)0x0) {
        this_14 = (MemoryDataParameter *)operator_new(0x28);
        MemoryDataParameter::MemoryDataParameter(this_14);
        this->memory_data_param_ = this_14;
      }
      from_14 = from->memory_data_param_;
      if (from_14 == (MemoryDataParameter *)0x0) {
        from_14 = (MemoryDataParameter *)&_MemoryDataParameter_default_instance_;
      }
      MemoryDataParameter::MergeFrom(this_14,from_14);
    }
  }
  if ((uVar4 & 0xff0000) != 0) {
    if ((uVar4 >> 0x10 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar1 = *pbVar1 | 1;
      this_15 = this->argmax_param_;
      if (this_15 == (ArgMaxParameter *)0x0) {
        this_15 = (ArgMaxParameter *)operator_new(0x28);
        ArgMaxParameter::ArgMaxParameter(this_15);
        this->argmax_param_ = this_15;
      }
      from_15 = from->argmax_param_;
      if (from_15 == (ArgMaxParameter *)0x0) {
        from_15 = (ArgMaxParameter *)&_ArgMaxParameter_default_instance_;
      }
      ArgMaxParameter::MergeFrom(this_15,from_15);
    }
    if ((uVar4 >> 0x11 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar1 = *pbVar1 | 2;
      this_16 = this->eltwise_param_;
      if (this_16 == (EltwiseParameter *)0x0) {
        this_16 = (EltwiseParameter *)operator_new(0x30);
        EltwiseParameter::EltwiseParameter(this_16);
        this->eltwise_param_ = this_16;
      }
      from_16 = from->eltwise_param_;
      if (from_16 == (EltwiseParameter *)0x0) {
        from_16 = (EltwiseParameter *)&_EltwiseParameter_default_instance_;
      }
      EltwiseParameter::MergeFrom(this_16,from_16);
    }
    if ((uVar4 >> 0x12 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar1 = *pbVar1 | 4;
      this_17 = this->threshold_param_;
      if (this_17 == (ThresholdParameter *)0x0) {
        this_17 = (ThresholdParameter *)operator_new(0x20);
        ThresholdParameter::ThresholdParameter(this_17);
        this->threshold_param_ = this_17;
      }
      from_17 = from->threshold_param_;
      if (from_17 == (ThresholdParameter *)0x0) {
        from_17 = (ThresholdParameter *)&_ThresholdParameter_default_instance_;
      }
      ThresholdParameter::MergeFrom(this_17,from_17);
    }
    if ((uVar4 >> 0x13 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar1 = *pbVar1 | 8;
      this_18 = this->dummy_data_param_;
      if (this_18 == (DummyDataParameter *)0x0) {
        this_18 = (DummyDataParameter *)operator_new(0x88);
        DummyDataParameter::DummyDataParameter(this_18);
        this->dummy_data_param_ = this_18;
      }
      from_18 = from->dummy_data_param_;
      if (from_18 == (DummyDataParameter *)0x0) {
        from_18 = (DummyDataParameter *)&_DummyDataParameter_default_instance_;
      }
      DummyDataParameter::MergeFrom(this_18,from_18);
    }
    if ((uVar4 >> 0x14 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar1 = *pbVar1 | 0x10;
      this_19 = this->accuracy_param_;
      if (this_19 == (AccuracyParameter *)0x0) {
        this_19 = (AccuracyParameter *)operator_new(0x28);
        AccuracyParameter::AccuracyParameter(this_19);
        this->accuracy_param_ = this_19;
      }
      from_19 = from->accuracy_param_;
      if (from_19 == (AccuracyParameter *)0x0) {
        from_19 = (AccuracyParameter *)&_AccuracyParameter_default_instance_;
      }
      AccuracyParameter::MergeFrom(this_19,from_19);
    }
    if ((uVar4 >> 0x15 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar1 = *pbVar1 | 0x20;
      this_20 = this->hinge_loss_param_;
      if (this_20 == (HingeLossParameter *)0x0) {
        this_20 = (HingeLossParameter *)operator_new(0x20);
        HingeLossParameter::HingeLossParameter(this_20);
        this->hinge_loss_param_ = this_20;
      }
      from_20 = from->hinge_loss_param_;
      if (from_20 == (HingeLossParameter *)0x0) {
        from_20 = (HingeLossParameter *)&_HingeLossParameter_default_instance_;
      }
      HingeLossParameter::MergeFrom(this_20,from_20);
    }
    if ((uVar4 >> 0x16 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar1 = *pbVar1 | 0x40;
      this_21 = this->relu_param_;
      if (this_21 == (ReLUParameter *)0x0) {
        this_21 = (ReLUParameter *)operator_new(0x20);
        ReLUParameter::ReLUParameter(this_21);
        this->relu_param_ = this_21;
      }
      from_21 = from->relu_param_;
      if (from_21 == (ReLUParameter *)0x0) {
        from_21 = (ReLUParameter *)&_ReLUParameter_default_instance_;
      }
      ReLUParameter::MergeFrom(this_21,from_21);
    }
    if ((uVar4 >> 0x17 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar1 = *pbVar1 | 0x80;
      this_22 = this->slice_param_;
      if (this_22 == (SliceParameter *)0x0) {
        this_22 = (SliceParameter *)operator_new(0x30);
        SliceParameter::SliceParameter(this_22);
        this->slice_param_ = this_22;
      }
      from_22 = from->slice_param_;
      if (from_22 == (SliceParameter *)0x0) {
        from_22 = (SliceParameter *)&_SliceParameter_default_instance_;
      }
      SliceParameter::MergeFrom(this_22,from_22);
    }
  }
  if (0xffffff < uVar4) {
    if ((uVar4 >> 0x18 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar1 = *pbVar1 | 1;
      this_23 = this->mvn_param_;
      if (this_23 == (MVNParameter *)0x0) {
        this_23 = (MVNParameter *)operator_new(0x20);
        MVNParameter::MVNParameter(this_23);
        this->mvn_param_ = this_23;
      }
      from_23 = from->mvn_param_;
      if (from_23 == (MVNParameter *)0x0) {
        from_23 = (MVNParameter *)&_MVNParameter_default_instance_;
      }
      MVNParameter::MergeFrom(this_23,from_23);
    }
    if ((uVar4 >> 0x19 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar1 = *pbVar1 | 2;
      this_24 = this->transform_param_;
      if (this_24 == (TransformationParameter *)0x0) {
        this_24 = (TransformationParameter *)operator_new(0x40);
        TransformationParameter::TransformationParameter(this_24);
        this->transform_param_ = this_24;
      }
      from_24 = from->transform_param_;
      if (from_24 == (TransformationParameter *)0x0) {
        from_24 = (TransformationParameter *)&_TransformationParameter_default_instance_;
      }
      TransformationParameter::MergeFrom(this_24,from_24);
    }
    if ((uVar4 >> 0x1a & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar1 = *pbVar1 | 4;
      this_25 = this->tanh_param_;
      if (this_25 == (TanHParameter *)0x0) {
        this_25 = (TanHParameter *)operator_new(0x20);
        TanHParameter::TanHParameter(this_25);
        this->tanh_param_ = this_25;
      }
      from_25 = from->tanh_param_;
      if (from_25 == (TanHParameter *)0x0) {
        from_25 = (TanHParameter *)&_TanHParameter_default_instance_;
      }
      TanHParameter::MergeFrom(this_25,from_25);
    }
    if ((uVar4 >> 0x1b & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar1 = *pbVar1 | 8;
      this_26 = this->sigmoid_param_;
      if (this_26 == (SigmoidParameter *)0x0) {
        this_26 = (SigmoidParameter *)operator_new(0x20);
        SigmoidParameter::SigmoidParameter(this_26);
        this->sigmoid_param_ = this_26;
      }
      from_26 = from->sigmoid_param_;
      if (from_26 == (SigmoidParameter *)0x0) {
        from_26 = (SigmoidParameter *)&_SigmoidParameter_default_instance_;
      }
      SigmoidParameter::MergeFrom(this_26,from_26);
    }
    if ((uVar4 >> 0x1c & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar1 = *pbVar1 | 0x10;
      this_27 = this->softmax_param_;
      if (this_27 == (SoftmaxParameter *)0x0) {
        this_27 = (SoftmaxParameter *)operator_new(0x20);
        SoftmaxParameter::SoftmaxParameter(this_27);
        this->softmax_param_ = this_27;
      }
      from_27 = from->softmax_param_;
      if (from_27 == (SoftmaxParameter *)0x0) {
        from_27 = (SoftmaxParameter *)&_SoftmaxParameter_default_instance_;
      }
      SoftmaxParameter::MergeFrom(this_27,from_27);
    }
    if ((uVar4 >> 0x1d & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar1 = *pbVar1 | 0x20;
      this_28 = this->contrastive_loss_param_;
      if (this_28 == (ContrastiveLossParameter *)0x0) {
        this_28 = (ContrastiveLossParameter *)operator_new(0x20);
        ContrastiveLossParameter::ContrastiveLossParameter(this_28);
        this->contrastive_loss_param_ = this_28;
      }
      from_28 = from->contrastive_loss_param_;
      if (from_28 == (ContrastiveLossParameter *)0x0) {
        from_28 = (ContrastiveLossParameter *)&_ContrastiveLossParameter_default_instance_;
      }
      ContrastiveLossParameter::MergeFrom(this_28,from_28);
    }
    if ((uVar4 >> 0x1e & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar1 = *pbVar1 | 0x40;
      this_29 = this->exp_param_;
      if (this_29 == (ExpParameter *)0x0) {
        this_29 = (ExpParameter *)operator_new(0x28);
        ExpParameter::ExpParameter(this_29);
        this->exp_param_ = this_29;
      }
      from_29 = from->exp_param_;
      if (from_29 == (ExpParameter *)0x0) {
        from_29 = (ExpParameter *)&_ExpParameter_default_instance_;
      }
      ExpParameter::MergeFrom(this_29,from_29);
    }
    if ((int)uVar4 < 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar1 = *pbVar1 | 0x80;
      this_30 = this->loss_param_;
      if (this_30 == (LossParameter *)0x0) {
        this_30 = (LossParameter *)operator_new(0x28);
        LossParameter::LossParameter(this_30);
        this->loss_param_ = this_30;
      }
      from_30 = from->loss_param_;
      if (from_30 == (LossParameter *)0x0) {
        from_30 = (LossParameter *)&_LossParameter_default_instance_;
      }
      LossParameter::MergeFrom(this_30,from_30);
    }
  }
  if (((from->_has_bits_).has_bits_[1] & 1) != 0) {
    uVar4 = from->type_;
    if (0x27 < uVar4) {
      __assert_fail("::caffe::V1LayerParameter_LayerType_IsValid(value)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/include/caffe/proto/caffe.pb.h"
                    ,0x5996,
                    "void caffe::V1LayerParameter::set_type(::caffe::V1LayerParameter_LayerType)");
    }
    puVar2 = (this->_has_bits_).has_bits_ + 1;
    *(byte *)puVar2 = (byte)*puVar2 | 1;
    this->type_ = uVar4;
  }
  return;
}

Assistant:

void V1LayerParameter::MergeFrom(const V1LayerParameter& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:caffe.V1LayerParameter)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  bottom_.MergeFrom(from.bottom_);
  top_.MergeFrom(from.top_);
  blobs_.MergeFrom(from.blobs_);
  blobs_lr_.MergeFrom(from.blobs_lr_);
  weight_decay_.MergeFrom(from.weight_decay_);
  include_.MergeFrom(from.include_);
  exclude_.MergeFrom(from.exclude_);
  loss_weight_.MergeFrom(from.loss_weight_);
  param_.MergeFrom(from.param_);
  blob_share_mode_.MergeFrom(from.blob_share_mode_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 255u) {
    if (cached_has_bits & 0x00000001u) {
      set_has_name();
      name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
    }
    if (cached_has_bits & 0x00000002u) {
      mutable_layer()->::caffe::V0LayerParameter::MergeFrom(from.layer());
    }
    if (cached_has_bits & 0x00000004u) {
      mutable_concat_param()->::caffe::ConcatParameter::MergeFrom(from.concat_param());
    }
    if (cached_has_bits & 0x00000008u) {
      mutable_convolution_param()->::caffe::ConvolutionParameter::MergeFrom(from.convolution_param());
    }
    if (cached_has_bits & 0x00000010u) {
      mutable_data_param()->::caffe::DataParameter::MergeFrom(from.data_param());
    }
    if (cached_has_bits & 0x00000020u) {
      mutable_dropout_param()->::caffe::DropoutParameter::MergeFrom(from.dropout_param());
    }
    if (cached_has_bits & 0x00000040u) {
      mutable_hdf5_data_param()->::caffe::HDF5DataParameter::MergeFrom(from.hdf5_data_param());
    }
    if (cached_has_bits & 0x00000080u) {
      mutable_hdf5_output_param()->::caffe::HDF5OutputParameter::MergeFrom(from.hdf5_output_param());
    }
  }
  if (cached_has_bits & 65280u) {
    if (cached_has_bits & 0x00000100u) {
      mutable_image_data_param()->::caffe::ImageDataParameter::MergeFrom(from.image_data_param());
    }
    if (cached_has_bits & 0x00000200u) {
      mutable_infogain_loss_param()->::caffe::InfogainLossParameter::MergeFrom(from.infogain_loss_param());
    }
    if (cached_has_bits & 0x00000400u) {
      mutable_inner_product_param()->::caffe::InnerProductParameter::MergeFrom(from.inner_product_param());
    }
    if (cached_has_bits & 0x00000800u) {
      mutable_lrn_param()->::caffe::LRNParameter::MergeFrom(from.lrn_param());
    }
    if (cached_has_bits & 0x00001000u) {
      mutable_pooling_param()->::caffe::PoolingParameter::MergeFrom(from.pooling_param());
    }
    if (cached_has_bits & 0x00002000u) {
      mutable_window_data_param()->::caffe::WindowDataParameter::MergeFrom(from.window_data_param());
    }
    if (cached_has_bits & 0x00004000u) {
      mutable_power_param()->::caffe::PowerParameter::MergeFrom(from.power_param());
    }
    if (cached_has_bits & 0x00008000u) {
      mutable_memory_data_param()->::caffe::MemoryDataParameter::MergeFrom(from.memory_data_param());
    }
  }
  if (cached_has_bits & 16711680u) {
    if (cached_has_bits & 0x00010000u) {
      mutable_argmax_param()->::caffe::ArgMaxParameter::MergeFrom(from.argmax_param());
    }
    if (cached_has_bits & 0x00020000u) {
      mutable_eltwise_param()->::caffe::EltwiseParameter::MergeFrom(from.eltwise_param());
    }
    if (cached_has_bits & 0x00040000u) {
      mutable_threshold_param()->::caffe::ThresholdParameter::MergeFrom(from.threshold_param());
    }
    if (cached_has_bits & 0x00080000u) {
      mutable_dummy_data_param()->::caffe::DummyDataParameter::MergeFrom(from.dummy_data_param());
    }
    if (cached_has_bits & 0x00100000u) {
      mutable_accuracy_param()->::caffe::AccuracyParameter::MergeFrom(from.accuracy_param());
    }
    if (cached_has_bits & 0x00200000u) {
      mutable_hinge_loss_param()->::caffe::HingeLossParameter::MergeFrom(from.hinge_loss_param());
    }
    if (cached_has_bits & 0x00400000u) {
      mutable_relu_param()->::caffe::ReLUParameter::MergeFrom(from.relu_param());
    }
    if (cached_has_bits & 0x00800000u) {
      mutable_slice_param()->::caffe::SliceParameter::MergeFrom(from.slice_param());
    }
  }
  if (cached_has_bits & 4278190080u) {
    if (cached_has_bits & 0x01000000u) {
      mutable_mvn_param()->::caffe::MVNParameter::MergeFrom(from.mvn_param());
    }
    if (cached_has_bits & 0x02000000u) {
      mutable_transform_param()->::caffe::TransformationParameter::MergeFrom(from.transform_param());
    }
    if (cached_has_bits & 0x04000000u) {
      mutable_tanh_param()->::caffe::TanHParameter::MergeFrom(from.tanh_param());
    }
    if (cached_has_bits & 0x08000000u) {
      mutable_sigmoid_param()->::caffe::SigmoidParameter::MergeFrom(from.sigmoid_param());
    }
    if (cached_has_bits & 0x10000000u) {
      mutable_softmax_param()->::caffe::SoftmaxParameter::MergeFrom(from.softmax_param());
    }
    if (cached_has_bits & 0x20000000u) {
      mutable_contrastive_loss_param()->::caffe::ContrastiveLossParameter::MergeFrom(from.contrastive_loss_param());
    }
    if (cached_has_bits & 0x40000000u) {
      mutable_exp_param()->::caffe::ExpParameter::MergeFrom(from.exp_param());
    }
    if (cached_has_bits & 0x80000000u) {
      mutable_loss_param()->::caffe::LossParameter::MergeFrom(from.loss_param());
    }
  }
  if (from.has_type()) {
    set_type(from.type());
  }
}